

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

string * __thiscall
nuraft::raft_server::get_aux_abi_cxx11_
          (string *__return_storage_ptr__,raft_server *this,int32 srv_id)

{
  _func_int *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var2;
  ptr<cluster_config> c_conf;
  _func_int **local_28;
  element_type *local_20;
  
  get_config((raft_server *)&stack0xffffffffffffffd8);
  pp_Var2 = local_28 + 7;
  do {
    pp_Var2 = (_func_int **)*pp_Var2;
    if (pp_Var2 == local_28 + 7) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      goto LAB_001b71f4;
    }
    p_Var1 = pp_Var2[2];
  } while (*(int *)p_Var1 != srv_id);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var2[3];
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(p_Var1 + 0x28),
             *(long *)(p_Var1 + 0x30) + *(long *)(p_Var1 + 0x28));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_001b71f4:
  if (local_20 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string raft_server::get_aux(int32 srv_id) const {
    ptr<cluster_config> c_conf = get_config();
    ptr<srv_config> s_conf = c_conf->get_server(srv_id);
    if (!s_conf) return std::string();

    return s_conf->get_aux();
}